

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O3

char * alcenumString(ALCenum x)

{
  char *pcVar1;
  
  if (x < 0xa001) {
    switch(x) {
    case 0x1000:
      return "ALC_MAJOR_VERSION";
    case 0x1001:
      return "ALC_MINOR_VERSION";
    case 0x1002:
      return "ALC_ATTRIBUTES_SIZE";
    case 0x1003:
      return "ALC_ALL_ATTRIBUTES";
    case 0x1004:
      return "ALC_DEFAULT_DEVICE_SPECIFIER";
    case 0x1005:
      return "ALC_DEVICE_SPECIFIER";
    case 0x1006:
      return "ALC_EXTENSIONS";
    case 0x1007:
      return "ALC_FREQUENCY";
    case 0x1008:
      return "ALC_REFRESH";
    case 0x1009:
      return "ALC_SYNC";
    case 0x100a:
    case 0x100b:
    case 0x100c:
    case 0x100d:
    case 0x100e:
    case 0x100f:
      break;
    case 0x1010:
      return "ALC_MONO_SOURCES";
    case 0x1011:
      return "ALC_STEREO_SOURCES";
    case 0x1012:
      return "ALC_DEFAULT_ALL_DEVICES_SPECIFIER";
    case 0x1013:
      return "ALC_ALL_DEVICES_SPECIFIER";
    default:
      switch(x) {
      case 0x310:
        return "ALC_CAPTURE_DEVICE_SPECIFIER";
      case 0x311:
        return "ALC_CAPTURE_DEFAULT_DEVICE_SPECIFIER";
      case 0x312:
        return "ALC_CAPTURE_SAMPLES";
      case 0x313:
        return "ALC_CONNECTED";
      }
      if (x == 0) {
        return "ALC_NO_ERROR";
      }
    }
  }
  else {
    switch(x) {
    case 0xa001:
      return "ALC_INVALID_DEVICE";
    case 0xa002:
      return "ALC_INVALID_CONTEXT";
    case 0xa003:
      return "ALC_INVALID_ENUM";
    case 0xa004:
      return "ALC_INVALID_VALUE";
    case 0xa005:
      return "ALC_OUT_OF_MEMORY";
    }
  }
  pcVar1 = sprintf_alloc("0x%X");
  return pcVar1;
}

Assistant:

const char *alcenumString(const ALCenum x)
{
    switch (x) {
        #define ENUM_TEST(e) case e: return #e
        ENUM_TEST(ALC_FREQUENCY);
        ENUM_TEST(ALC_REFRESH);
        ENUM_TEST(ALC_SYNC);
        ENUM_TEST(ALC_MONO_SOURCES);
        ENUM_TEST(ALC_STEREO_SOURCES);
        ENUM_TEST(ALC_NO_ERROR);
        ENUM_TEST(ALC_INVALID_DEVICE);
        ENUM_TEST(ALC_INVALID_CONTEXT);
        ENUM_TEST(ALC_INVALID_ENUM);
        ENUM_TEST(ALC_INVALID_VALUE);
        ENUM_TEST(ALC_OUT_OF_MEMORY);
        ENUM_TEST(ALC_MAJOR_VERSION);
        ENUM_TEST(ALC_MINOR_VERSION);
        ENUM_TEST(ALC_ATTRIBUTES_SIZE);
        ENUM_TEST(ALC_ALL_ATTRIBUTES);
        ENUM_TEST(ALC_DEFAULT_DEVICE_SPECIFIER);
        ENUM_TEST(ALC_DEVICE_SPECIFIER);
        ENUM_TEST(ALC_EXTENSIONS);
        ENUM_TEST(ALC_CAPTURE_DEVICE_SPECIFIER);
        ENUM_TEST(ALC_CAPTURE_DEFAULT_DEVICE_SPECIFIER);
        ENUM_TEST(ALC_CAPTURE_SAMPLES);
        ENUM_TEST(ALC_DEFAULT_ALL_DEVICES_SPECIFIER);
        ENUM_TEST(ALC_ALL_DEVICES_SPECIFIER);
        ENUM_TEST(ALC_CONNECTED);
        #undef ENUM_TEST
        default: break;
    }

    return sprintf_alloc("0x%X", (uint) x);
}